

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cc
# Opt level: O0

void PrintTrace(void)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  trace;
  ostream *in_stack_ffffffffffffffc0;
  uint local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18;
  
  TraceContext::GetTrace_abi_cxx11_();
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_18);
    if (sVar1 <= local_1c) break;
    in_stack_ffffffffffffffc0 = std::operator<<((ostream *)&std::cerr,"Frame ");
    poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffc0,local_1c);
    poVar2 = std::operator<<(poVar2,": ");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_18,(ulong)local_1c);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void PrintTrace() {
  const auto trace = TraceContext::GetTrace();
  for (unsigned int i = 0; i < trace.size(); ++i) {
    std::cerr << "Frame " << i << ": " << trace[i] << std::endl;
  }
}